

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

TestCase * TestCharReaderTestparseWithOneError::factory(void)

{
  TestCase *this;
  
  this = (TestCase *)operator_new(0x10);
  (((CharReaderTest *)&this->_vptr_TestCase)->super_TestCase)._vptr_TestCase = (_func_int **)0x0;
  this->result_ = (TestResult *)0x0;
  TestCharReaderTestparseWithOneError((TestCharReaderTestparseWithOneError *)this);
  return this;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithOneError) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
      "{ \"property\" :: \"value\" }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT(errs ==
                  "* Line 1, Column 15\n  Syntax error: value, object or array "
                  "expected.\n");
  delete reader;
}